

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall kj::anon_unknown_123::AsyncPipe::whenWriteDisconnected(AsyncPipe *this)

{
  SourceLocation location;
  long in_RSI;
  ForkedPromise<void> *p;
  ForkedPromise<void> fork;
  PromiseFulfillerPair<void> paf;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> local_88;
  char *local_70;
  char *pcStackY_68;
  undefined8 in_stack_ffffffffffffffa0;
  PromiseFulfillerPair<void> local_40;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else if (*(char *)(in_RSI + 0x50) == '\x01') {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
  }
  else {
    location.function =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    location.fileName = (char *)in_stack_ffffffffffffffa0;
    location._16_8_ = "whenWriteDisconnected";
    newPromiseAndFulfiller<void>(location);
    local_88.disposer = local_40.fulfiller.disposer;
    local_88.ptr = (ForkHub<kj::_::Void> *)local_40.fulfiller.ptr;
    local_40.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x40),
               (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_88);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_88);
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
    ;
    pcStackY_68 = "whenWriteDisconnected";
    Promise<void>::fork((Promise<void> *)&local_88);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
    kj::_::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
              ((NullableValue<kj::ForkedPromise<void>> *)(in_RSI + 0x50),
               (ForkedPromise<void> *)&local_88);
    Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&local_88);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_40);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (readAborted) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(p, readAbortPromise) {
      return p.addBranch();
    } else {
      auto paf = newPromiseAndFulfiller<void>();
      readAbortFulfiller = kj::mv(paf.fulfiller);
      auto fork = paf.promise.fork();
      auto result = fork.addBranch();
      readAbortPromise = kj::mv(fork);
      return result;
    }